

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj_test.c
# Opt level: O2

rk_s32 kmpp_obj_by_name_test(char *name,rk_u32 flag)

{
  int iVar1;
  KmppObj obj;
  
  obj = (KmppObj)0x0;
  iVar1 = kmpp_obj_get_by_name(&obj,name,"kmpp_obj_by_name_test");
  if (iVar1 == 0) {
    if ((flag & 4) != 0) {
      kmpp_obj_udump_f(obj,"kmpp_obj_by_name_test");
    }
    if ((flag & 8) != 0) {
      kmpp_obj_kdump_f(obj,"kmpp_obj_by_name_test");
    }
    iVar1 = kmpp_obj_put(obj,"kmpp_obj_by_name_test");
    if (iVar1 == 0) {
      return 0;
    }
    _mpp_log_l(4,"kmpp_obj_test","kmpp_obj_put %s failed\n",0,name);
  }
  else {
    _mpp_log_l(4,"kmpp_obj_test","kmpp_obj_get_by_name %s failed ret %d\n",0,name,iVar1);
  }
  if (obj != (KmppObj)0x0) {
    kmpp_obj_put(obj,"kmpp_obj_by_name_test");
  }
  return iVar1;
}

Assistant:

static rk_s32 kmpp_obj_by_name_test(const char *name, rk_u32 flag)
{
    KmppObj obj = NULL;
    MPP_RET ret = MPP_NOK;

    ret = kmpp_obj_get_by_name_f(&obj, name);
    if (ret) {
        mpp_log("kmpp_obj_get_by_name %s failed ret %d\n", name, ret);
        goto done;
    }

    if (flag & TEST_OBJ_UDUMP)
        kmpp_obj_udump(obj);
    if (flag & TEST_OBJ_KDUMP)
        kmpp_obj_kdump(obj);

    ret = kmpp_obj_put_f(obj);
    if (ret) {
        mpp_log("kmpp_obj_put %s failed\n", name);
        goto done;
    }
    obj = NULL;

done:
    if (obj)
        kmpp_obj_put_f(obj);

    return ret;
}